

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int exprMightBeIndexed2(SrcList *pFrom,Bitmask mPrereq,int *aiCurCol,Expr *pExpr)

{
  int iTab;
  int iVar1;
  int local_3c;
  int iCur;
  int i;
  Index *pIdx;
  Expr *pExpr_local;
  int *aiCurCol_local;
  Bitmask mPrereq_local;
  SrcList *pFrom_local;
  
  local_3c = 0;
  for (aiCurCol_local = (int *)mPrereq; &DAT_00000001 < aiCurCol_local;
      aiCurCol_local = (int *)((ulong)aiCurCol_local >> 1)) {
    local_3c = local_3c + 1;
  }
  iTab = pFrom->a[local_3c].iCursor;
  _iCur = (pFrom->a[local_3c].pTab)->pIndex;
  do {
    if (_iCur == (Index *)0x0) {
      return 0;
    }
    if (_iCur->aColExpr != (ExprList *)0x0) {
      for (local_3c = 0; local_3c < (int)(uint)_iCur->nKeyCol; local_3c = local_3c + 1) {
        if ((_iCur->aiColumn[local_3c] == -2) &&
           (iVar1 = sqlite3ExprCompareSkip(pExpr,_iCur->aColExpr->a[local_3c].pExpr,iTab),
           iVar1 == 0)) {
          *aiCurCol = iTab;
          aiCurCol[1] = -2;
          return 1;
        }
      }
    }
    _iCur = _iCur->pNext;
  } while( true );
}

Assistant:

static SQLITE_NOINLINE int exprMightBeIndexed2(
  SrcList *pFrom,        /* The FROM clause */
  Bitmask mPrereq,       /* Bitmask of FROM clause terms referenced by pExpr */
  int *aiCurCol,         /* Write the referenced table cursor and column here */
  Expr *pExpr            /* An operand of a comparison operator */
){
  Index *pIdx;
  int i;
  int iCur;
  for(i=0; mPrereq>1; i++, mPrereq>>=1){}
  iCur = pFrom->a[i].iCursor;
  for(pIdx=pFrom->a[i].pTab->pIndex; pIdx; pIdx=pIdx->pNext){
    if( pIdx->aColExpr==0 ) continue;
    for(i=0; i<pIdx->nKeyCol; i++){
      if( pIdx->aiColumn[i]!=XN_EXPR ) continue;
      if( sqlite3ExprCompareSkip(pExpr, pIdx->aColExpr->a[i].pExpr, iCur)==0 ){
        aiCurCol[0] = iCur;
        aiCurCol[1] = XN_EXPR;
        return 1;
      }
    }
  }
  return 0;
}